

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O2

void __thiscall
SuiteSessionTests::initiatorFixtureResendRequest_AResentMessageReceivesADoNotSendExceptionHelper::
~initiatorFixtureResendRequest_AResentMessageReceivesADoNotSendExceptionHelper
          (initiatorFixtureResendRequest_AResentMessageReceivesADoNotSendExceptionHelper *this)

{
  sessionFixture::~sessionFixture((sessionFixture *)&this[-1].m_details);
  return;
}

Assistant:

TEST_FIXTURE(initiatorFixture, ResendRequest_AResentMessageReceivesADoNotSendException) {
  startLoggedOn();

  FIX::Message neworder1 = createNewOrderSingle("ISLD", "TW", 2);
  object->send(neworder1);

  FIX::Message neworder2 = createNewOrderSingle("ISLD", "TW", 3);
  neworder2.setField(FIX::Text("DoNotSend"));
  object->send(neworder2);

  this->checkForDoNotSend = true;

  FIX::Message resendReq = createResendRequest( "ISLD", "TW", 2, 1, 8);
  object->next(resendReq, UtcTimeStamp());

  CHECK_EQUAL(5, object->getExpectedSenderNum());
  CHECK_EQUAL(3, object->getExpectedTargetNum());
}